

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  uint uVar1;
  BVH *bvh;
  float *pfVar2;
  Geometry *pGVar3;
  RTCRayQueryContext *pRVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  size_t k;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  RayK<8> *pRVar28;
  byte bVar29;
  byte bVar30;
  int iVar31;
  undefined1 (*pauVar32) [32];
  byte bVar33;
  ulong uVar34;
  float *vertices;
  undefined4 uVar35;
  ulong uVar36;
  NodeRef root;
  long lVar37;
  byte bVar38;
  ulong *puVar39;
  bool bVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar88 [64];
  float fVar89;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar90 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2ae1;
  RayK<8> *local_2ae0;
  ulong local_2ad8;
  ulong local_2ad0;
  RayK<8> *local_2ac8;
  undefined4 local_2abc;
  undefined1 (*local_2ab8) [32];
  RTCFilterFunctionNArguments local_2ab0;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  ulong local_2a30;
  Scene *local_2a28;
  undefined1 local_2a20 [32];
  RTCHitN local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  uint local_2920;
  uint uStack_291c;
  uint uStack_2918;
  uint uStack_2914;
  uint uStack_2910;
  uint uStack_290c;
  uint uStack_2908;
  uint uStack_2904;
  uint local_2900;
  uint uStack_28fc;
  uint uStack_28f8;
  uint uStack_28f4;
  uint uStack_28f0;
  uint uStack_28ec;
  uint uStack_28e8;
  uint uStack_28e4;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_28e0;
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  int local_27c0;
  int iStack_27bc;
  int iStack_27b8;
  int iStack_27b4;
  int iStack_27b0;
  int iStack_27ac;
  int iStack_27a8;
  int iStack_27a4;
  uint local_27a0;
  uint uStack_279c;
  uint uStack_2798;
  uint uStack_2794;
  uint uStack_2790;
  uint uStack_278c;
  uint uStack_2788;
  uint uStack_2784;
  uint local_2780;
  uint uStack_277c;
  uint uStack_2778;
  uint uStack_2774;
  uint uStack_2770;
  uint uStack_276c;
  uint uStack_2768;
  uint uStack_2764;
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar43 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar77 = ZEXT816(0) << 0x40;
      uVar41 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar77),5);
      uVar36 = vpcmpeqd_avx512vl(auVar43,(undefined1  [32])valid_i->field_0);
      uVar41 = uVar41 & uVar36;
      bVar30 = (byte)uVar41;
      if (bVar30 != 0) {
        local_28e0._0_8_ = *(undefined8 *)ray;
        local_28e0._8_8_ = *(undefined8 *)(ray + 8);
        local_28e0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_28e0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_28e0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_28e0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_28e0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_28e0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_28e0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_28e0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_28e0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_28e0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2880 = *(undefined1 (*) [32])(ray + 0x80);
        local_2860 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2840 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar100 = ZEXT3264(auVar43);
        vandps_avx512vl(local_2880,auVar43);
        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        auVar101 = ZEXT3264(auVar44);
        uVar36 = vcmpps_avx512vl(auVar43,auVar44,1);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar102 = ZEXT3264(auVar45);
        auVar46 = vdivps_avx512vl(auVar45,local_2880);
        vandps_avx512vl(local_2860,auVar43);
        uVar34 = vcmpps_avx512vl(auVar46,auVar44,1);
        auVar47 = vdivps_avx512vl(auVar45,local_2860);
        vandps_avx512vl(local_2840,auVar43);
        uVar13 = vcmpps_avx512vl(auVar47,auVar44,1);
        auVar43 = vdivps_avx512vl(auVar45,local_2840);
        auVar83 = ZEXT3264(CONCAT428(0x5d5e0b6b,
                                     CONCAT424(0x5d5e0b6b,
                                               CONCAT420(0x5d5e0b6b,
                                                         CONCAT416(0x5d5e0b6b,
                                                                   CONCAT412(0x5d5e0b6b,
                                                                             CONCAT48(0x5d5e0b6b,
                                                                                                                                                                            
                                                  0x5d5e0b6b5d5e0b6b)))))));
        bVar40 = (bool)((byte)uVar36 & 1);
        local_2820._0_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar46._0_4_;
        bVar40 = (bool)((byte)(uVar36 >> 1) & 1);
        local_2820._4_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar46._4_4_;
        bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
        fStack_2818 = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar46._8_4_);
        bVar40 = (bool)((byte)(uVar36 >> 3) & 1);
        fStack_2814 = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar46._12_4_);
        bVar40 = (bool)((byte)(uVar36 >> 4) & 1);
        fStack_2810 = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar46._16_4_);
        bVar40 = (bool)((byte)(uVar36 >> 5) & 1);
        fStack_280c = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar46._20_4_);
        bVar40 = (bool)((byte)(uVar36 >> 6) & 1);
        fStack_2808 = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar46._24_4_);
        bVar40 = SUB81(uVar36 >> 7,0);
        register0x00000918 = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar46._28_4_;
        bVar40 = (bool)((byte)uVar34 & 1);
        local_2800._0_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar47._0_4_;
        bVar40 = (bool)((byte)(uVar34 >> 1) & 1);
        local_2800._4_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar47._4_4_;
        bVar40 = (bool)((byte)(uVar34 >> 2) & 1);
        fStack_27f8 = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar47._8_4_);
        bVar40 = (bool)((byte)(uVar34 >> 3) & 1);
        fStack_27f4 = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar47._12_4_);
        bVar40 = (bool)((byte)(uVar34 >> 4) & 1);
        fStack_27f0 = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar47._16_4_);
        bVar40 = (bool)((byte)(uVar34 >> 5) & 1);
        fStack_27ec = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar47._20_4_);
        bVar40 = (bool)((byte)(uVar34 >> 6) & 1);
        fStack_27e8 = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar47._24_4_);
        bVar40 = SUB81(uVar34 >> 7,0);
        register0x00000918 = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar47._28_4_;
        bVar40 = (bool)((byte)uVar13 & 1);
        local_27e0._0_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar43._0_4_;
        bVar40 = (bool)((byte)(uVar13 >> 1) & 1);
        local_27e0._4_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar43._4_4_;
        bVar40 = (bool)((byte)(uVar13 >> 2) & 1);
        fStack_27d8 = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar43._8_4_);
        bVar40 = (bool)((byte)(uVar13 >> 3) & 1);
        fStack_27d4 = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar43._12_4_);
        bVar40 = (bool)((byte)(uVar13 >> 4) & 1);
        fStack_27d0 = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar43._16_4_);
        bVar40 = (bool)((byte)(uVar13 >> 5) & 1);
        fStack_27cc = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar43._20_4_);
        bVar40 = (bool)((byte)(uVar13 >> 6) & 1);
        fStack_27c8 = (float)((uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar43._24_4_);
        bVar40 = SUB81(uVar13 >> 7,0);
        register0x00000918 = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar43._28_4_;
        uVar36 = vcmpps_avx512vl(_local_2820,ZEXT1632(auVar77),1);
        auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_27c0 = (uint)((byte)uVar36 & 1) * auVar43._0_4_;
        iStack_27bc = (uint)((byte)(uVar36 >> 1) & 1) * auVar43._4_4_;
        iStack_27b8 = (uint)((byte)(uVar36 >> 2) & 1) * auVar43._8_4_;
        iStack_27b4 = (uint)((byte)(uVar36 >> 3) & 1) * auVar43._12_4_;
        iStack_27b0 = (uint)((byte)(uVar36 >> 4) & 1) * auVar43._16_4_;
        iStack_27ac = (uint)((byte)(uVar36 >> 5) & 1) * auVar43._20_4_;
        iStack_27a8 = (uint)((byte)(uVar36 >> 6) & 1) * auVar43._24_4_;
        iStack_27a4 = (uint)(byte)(uVar36 >> 7) * auVar43._28_4_;
        auVar44 = ZEXT1632(auVar77);
        uVar36 = vcmpps_avx512vl(_local_2800,auVar44,5);
        auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar40 = (bool)((byte)uVar36 & 1);
        local_27a0 = (uint)bVar40 * auVar43._0_4_ | (uint)!bVar40 * 0x30;
        bVar40 = (bool)((byte)(uVar36 >> 1) & 1);
        uStack_279c = (uint)bVar40 * auVar43._4_4_ | (uint)!bVar40 * 0x30;
        bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
        uStack_2798 = (uint)bVar40 * auVar43._8_4_ | (uint)!bVar40 * 0x30;
        bVar40 = (bool)((byte)(uVar36 >> 3) & 1);
        uStack_2794 = (uint)bVar40 * auVar43._12_4_ | (uint)!bVar40 * 0x30;
        bVar40 = (bool)((byte)(uVar36 >> 4) & 1);
        uStack_2790 = (uint)bVar40 * auVar43._16_4_ | (uint)!bVar40 * 0x30;
        bVar40 = (bool)((byte)(uVar36 >> 5) & 1);
        uStack_278c = (uint)bVar40 * auVar43._20_4_ | (uint)!bVar40 * 0x30;
        bVar40 = (bool)((byte)(uVar36 >> 6) & 1);
        uStack_2788 = (uint)bVar40 * auVar43._24_4_ | (uint)!bVar40 * 0x30;
        bVar40 = SUB81(uVar36 >> 7,0);
        uStack_2784 = (uint)bVar40 * auVar43._28_4_ | (uint)!bVar40 * 0x30;
        uVar36 = vcmpps_avx512vl(_local_27e0,auVar44,5);
        auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar40 = (bool)((byte)uVar36 & 1);
        local_2780 = (uint)bVar40 * auVar43._0_4_ | (uint)!bVar40 * 0x50;
        bVar40 = (bool)((byte)(uVar36 >> 1) & 1);
        uStack_277c = (uint)bVar40 * auVar43._4_4_ | (uint)!bVar40 * 0x50;
        bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
        uStack_2778 = (uint)bVar40 * auVar43._8_4_ | (uint)!bVar40 * 0x50;
        bVar40 = (bool)((byte)(uVar36 >> 3) & 1);
        uStack_2774 = (uint)bVar40 * auVar43._12_4_ | (uint)!bVar40 * 0x50;
        bVar40 = (bool)((byte)(uVar36 >> 4) & 1);
        uStack_2770 = (uint)bVar40 * auVar43._16_4_ | (uint)!bVar40 * 0x50;
        bVar40 = (bool)((byte)(uVar36 >> 5) & 1);
        uStack_276c = (uint)bVar40 * auVar43._20_4_ | (uint)!bVar40 * 0x50;
        bVar40 = (bool)((byte)(uVar36 >> 6) & 1);
        uStack_2768 = (uint)bVar40 * auVar43._24_4_ | (uint)!bVar40 * 0x50;
        bVar40 = SUB81(uVar36 >> 7,0);
        uStack_2764 = (uint)bVar40 * auVar43._28_4_ | (uint)!bVar40 * 0x50;
        local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar104 = ZEXT3264(local_1e80);
        auVar43 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar44);
        local_2760._0_4_ =
             (uint)(bVar30 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar30 & 1) * local_1e80._0_4_;
        bVar40 = (bool)((byte)(uVar41 >> 1) & 1);
        local_2760._4_4_ = (uint)bVar40 * auVar43._4_4_ | (uint)!bVar40 * local_1e80._4_4_;
        bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
        local_2760._8_4_ = (uint)bVar40 * auVar43._8_4_ | (uint)!bVar40 * local_1e80._8_4_;
        bVar40 = (bool)((byte)(uVar41 >> 3) & 1);
        local_2760._12_4_ = (uint)bVar40 * auVar43._12_4_ | (uint)!bVar40 * local_1e80._12_4_;
        bVar40 = (bool)((byte)(uVar41 >> 4) & 1);
        local_2760._16_4_ = (uint)bVar40 * auVar43._16_4_ | (uint)!bVar40 * local_1e80._16_4_;
        bVar40 = (bool)((byte)(uVar41 >> 5) & 1);
        local_2760._20_4_ = (uint)bVar40 * auVar43._20_4_ | (uint)!bVar40 * local_1e80._20_4_;
        bVar40 = (bool)((byte)(uVar41 >> 6) & 1);
        local_2760._24_4_ = (uint)bVar40 * auVar43._24_4_ | (uint)!bVar40 * local_1e80._24_4_;
        bVar40 = SUB81(uVar41 >> 7,0);
        local_2760._28_4_ = (uint)bVar40 * auVar43._28_4_ | (uint)!bVar40 * local_1e80._28_4_;
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar103 = ZEXT3264(auVar43);
        local_2abc = (undefined4)uVar41;
        auVar44 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar44);
        bVar40 = (bool)((byte)(uVar41 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar41 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar41 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar41 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar41 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar41 >> 6) & 1);
        bVar11 = SUB81(uVar41 >> 7,0);
        local_2740._4_4_ = (uint)bVar40 * auVar44._4_4_ | (uint)!bVar40 * auVar43._4_4_;
        local_2740._0_4_ =
             (uint)(bVar30 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar43._0_4_;
        local_2740._8_4_ = (uint)bVar6 * auVar44._8_4_ | (uint)!bVar6 * auVar43._8_4_;
        local_2740._12_4_ = (uint)bVar7 * auVar44._12_4_ | (uint)!bVar7 * auVar43._12_4_;
        local_2740._16_4_ = (uint)bVar8 * auVar44._16_4_ | (uint)!bVar8 * auVar43._16_4_;
        local_2740._20_4_ = (uint)bVar9 * auVar44._20_4_ | (uint)!bVar9 * auVar43._20_4_;
        local_2740._24_4_ = (uint)bVar10 * auVar44._24_4_ | (uint)!bVar10 * auVar43._24_4_;
        local_2740._28_4_ = (uint)bVar11 * auVar44._28_4_ | (uint)!bVar11 * auVar43._28_4_;
        bVar30 = ~bVar30;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar41 = 5;
        }
        else {
          uVar41 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2ac8 = ray + 0x100;
        puVar39 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar32 = (undefined1 (*) [32])local_1e40;
        local_2608 = (bvh->root).ptr;
        local_1e60 = local_2760;
        local_2ab8 = (undefined1 (*) [32])&local_2920;
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar105 = ZEXT3264(auVar43);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar99 = ZEXT3264(auVar43);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar98 = ZEXT3264(auVar43);
        local_2ad0 = uVar41;
LAB_007acda4:
        pauVar32 = pauVar32 + -1;
        root.ptr = puVar39[-1];
        puVar39 = puVar39 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_007add76;
        local_2a80 = *pauVar32;
        uVar36 = vcmpps_avx512vl(local_2a80,local_2740,1);
        if ((char)uVar36 == '\0') {
LAB_007add87:
          iVar31 = 2;
        }
        else {
          uVar35 = (undefined4)uVar36;
          iVar31 = 0;
          pRVar28 = ray;
          if ((uint)POPCOUNT(uVar35) <= uVar41) {
            do {
              local_2ae0 = pRVar28;
              k = 0;
              for (uVar41 = uVar36; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              auVar83 = ZEXT1664(auVar83._0_16_);
              in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
              bVar40 = occluded1(This,bvh,root,k,&local_2ae1,local_2ae0,
                                 (TravRayK<8,_true> *)&local_28e0.field_0,context);
              bVar29 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar40) {
                bVar29 = 0;
              }
              bVar30 = bVar30 | bVar29;
              uVar36 = uVar36 - 1 & uVar36;
              pRVar28 = local_2ae0;
            } while (uVar36 != 0);
            if (bVar30 == 0xff) {
              iVar31 = 3;
            }
            else {
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_2740._0_4_ =
                   (uint)(bVar30 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar30 & 1) * local_2740._0_4_
              ;
              bVar40 = (bool)(bVar30 >> 1 & 1);
              local_2740._4_4_ = (uint)bVar40 * auVar43._4_4_ | (uint)!bVar40 * local_2740._4_4_;
              bVar40 = (bool)(bVar30 >> 2 & 1);
              local_2740._8_4_ = (uint)bVar40 * auVar43._8_4_ | (uint)!bVar40 * local_2740._8_4_;
              bVar40 = (bool)(bVar30 >> 3 & 1);
              local_2740._12_4_ = (uint)bVar40 * auVar43._12_4_ | (uint)!bVar40 * local_2740._12_4_;
              bVar40 = (bool)(bVar30 >> 4 & 1);
              local_2740._16_4_ = (uint)bVar40 * auVar43._16_4_ | (uint)!bVar40 * local_2740._16_4_;
              bVar40 = (bool)(bVar30 >> 5 & 1);
              local_2740._20_4_ = (uint)bVar40 * auVar43._20_4_ | (uint)!bVar40 * local_2740._20_4_;
              bVar40 = (bool)(bVar30 >> 6 & 1);
              local_2740._24_4_ = (uint)bVar40 * auVar43._24_4_ | (uint)!bVar40 * local_2740._24_4_;
              local_2740._28_4_ =
                   (uint)(bVar30 >> 7) * auVar43._28_4_ |
                   (uint)!(bool)(bVar30 >> 7) * local_2740._28_4_;
              iVar31 = 2;
            }
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar100 = ZEXT3264(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
            auVar101 = ZEXT3264(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar102 = ZEXT3264(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar103 = ZEXT3264(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar104 = ZEXT3264(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar105 = ZEXT3264(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar99 = ZEXT3264(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar98 = ZEXT3264(auVar43);
            ray = local_2ae0;
          }
          auVar90 = ZEXT3264(local_2a80);
          uVar41 = local_2ad0;
          if ((uint)local_2ad0 < (uint)POPCOUNT(uVar35)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_007add76;
                uVar15 = vcmpps_avx512vl(auVar90._0_32_,local_2740,9);
                if ((char)uVar15 == '\0') goto LAB_007add87;
                local_2a30 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar29 = bVar30;
                if (local_2a30 == 0) goto LAB_007add47;
                bVar29 = ~bVar30;
                lVar37 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                uVar41 = 0;
                goto LAB_007acfcf;
              }
              auVar90 = ZEXT3264(auVar104._0_32_);
              uVar36 = 0;
              uVar34 = 8;
              do {
                uVar13 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar36 * 8);
                if (uVar13 != 8) {
                  uVar35 = *(undefined4 *)(root.ptr + 0x20 + uVar36 * 4);
                  auVar69._4_4_ = uVar35;
                  auVar69._0_4_ = uVar35;
                  auVar69._8_4_ = uVar35;
                  auVar69._12_4_ = uVar35;
                  auVar69._16_4_ = uVar35;
                  auVar69._20_4_ = uVar35;
                  auVar69._24_4_ = uVar35;
                  auVar69._28_4_ = uVar35;
                  auVar25._8_8_ = local_28e0._8_8_;
                  auVar25._0_8_ = local_28e0._0_8_;
                  auVar25._16_8_ = local_28e0._16_8_;
                  auVar25._24_8_ = local_28e0._24_8_;
                  auVar26._8_8_ = local_28e0._40_8_;
                  auVar26._0_8_ = local_28e0._32_8_;
                  auVar26._16_8_ = local_28e0._48_8_;
                  auVar26._24_8_ = local_28e0._56_8_;
                  auVar27._8_8_ = local_28e0._72_8_;
                  auVar27._0_8_ = local_28e0._64_8_;
                  auVar27._16_8_ = local_28e0._80_8_;
                  auVar27._24_8_ = local_28e0._88_8_;
                  auVar43 = vsubps_avx(auVar69,auVar25);
                  auVar84._0_4_ = (float)local_2820._0_4_ * auVar43._0_4_;
                  auVar84._4_4_ = (float)local_2820._4_4_ * auVar43._4_4_;
                  auVar84._8_4_ = fStack_2818 * auVar43._8_4_;
                  auVar84._12_4_ = fStack_2814 * auVar43._12_4_;
                  auVar84._16_4_ = fStack_2810 * auVar43._16_4_;
                  auVar84._20_4_ = fStack_280c * auVar43._20_4_;
                  auVar84._28_36_ = auVar83._28_36_;
                  auVar84._24_4_ = fStack_2808 * auVar43._24_4_;
                  auVar46 = auVar84._0_32_;
                  auVar83 = ZEXT3264(auVar46);
                  uVar35 = *(undefined4 *)(root.ptr + 0x40 + uVar36 * 4);
                  auVar70._4_4_ = uVar35;
                  auVar70._0_4_ = uVar35;
                  auVar70._8_4_ = uVar35;
                  auVar70._12_4_ = uVar35;
                  auVar70._16_4_ = uVar35;
                  auVar70._20_4_ = uVar35;
                  auVar70._24_4_ = uVar35;
                  auVar70._28_4_ = uVar35;
                  auVar43 = vsubps_avx(auVar70,auVar26);
                  auVar86._0_4_ = (float)local_2800._0_4_ * auVar43._0_4_;
                  auVar86._4_4_ = (float)local_2800._4_4_ * auVar43._4_4_;
                  auVar86._8_4_ = fStack_27f8 * auVar43._8_4_;
                  auVar86._12_4_ = fStack_27f4 * auVar43._12_4_;
                  auVar86._16_4_ = fStack_27f0 * auVar43._16_4_;
                  auVar86._20_4_ = fStack_27ec * auVar43._20_4_;
                  auVar86._28_36_ = in_ZMM7._28_36_;
                  auVar86._24_4_ = fStack_27e8 * auVar43._24_4_;
                  auVar47 = auVar86._0_32_;
                  in_ZMM7 = ZEXT3264(auVar47);
                  uVar35 = *(undefined4 *)(root.ptr + 0x60 + uVar36 * 4);
                  auVar71._4_4_ = uVar35;
                  auVar71._0_4_ = uVar35;
                  auVar71._8_4_ = uVar35;
                  auVar71._12_4_ = uVar35;
                  auVar71._16_4_ = uVar35;
                  auVar71._20_4_ = uVar35;
                  auVar71._24_4_ = uVar35;
                  auVar71._28_4_ = uVar35;
                  auVar43 = vsubps_avx(auVar71,auVar27);
                  auVar88._0_4_ = (float)local_27e0._0_4_ * auVar43._0_4_;
                  auVar88._4_4_ = (float)local_27e0._4_4_ * auVar43._4_4_;
                  auVar88._8_4_ = fStack_27d8 * auVar43._8_4_;
                  auVar88._12_4_ = fStack_27d4 * auVar43._12_4_;
                  auVar88._16_4_ = fStack_27d0 * auVar43._16_4_;
                  auVar88._20_4_ = fStack_27cc * auVar43._20_4_;
                  auVar88._28_36_ = in_ZMM9._28_36_;
                  auVar88._24_4_ = fStack_27c8 * auVar43._24_4_;
                  auVar76 = auVar88._0_32_;
                  in_ZMM9 = ZEXT3264(auVar76);
                  uVar35 = *(undefined4 *)(root.ptr + 0x30 + uVar36 * 4);
                  auVar72._4_4_ = uVar35;
                  auVar72._0_4_ = uVar35;
                  auVar72._8_4_ = uVar35;
                  auVar72._12_4_ = uVar35;
                  auVar72._16_4_ = uVar35;
                  auVar72._20_4_ = uVar35;
                  auVar72._24_4_ = uVar35;
                  auVar72._28_4_ = uVar35;
                  auVar43 = vsubps_avx(auVar72,auVar25);
                  auVar20._4_4_ = (float)local_2820._4_4_ * auVar43._4_4_;
                  auVar20._0_4_ = (float)local_2820._0_4_ * auVar43._0_4_;
                  auVar20._8_4_ = fStack_2818 * auVar43._8_4_;
                  auVar20._12_4_ = fStack_2814 * auVar43._12_4_;
                  auVar20._16_4_ = fStack_2810 * auVar43._16_4_;
                  auVar20._20_4_ = fStack_280c * auVar43._20_4_;
                  auVar20._24_4_ = fStack_2808 * auVar43._24_4_;
                  auVar20._28_4_ = (int)((ulong)local_28e0._24_8_ >> 0x20);
                  uVar35 = *(undefined4 *)(root.ptr + 0x50 + uVar36 * 4);
                  auVar73._4_4_ = uVar35;
                  auVar73._0_4_ = uVar35;
                  auVar73._8_4_ = uVar35;
                  auVar73._12_4_ = uVar35;
                  auVar73._16_4_ = uVar35;
                  auVar73._20_4_ = uVar35;
                  auVar73._24_4_ = uVar35;
                  auVar73._28_4_ = uVar35;
                  auVar43 = vsubps_avx(auVar73,auVar26);
                  auVar21._4_4_ = (float)local_2800._4_4_ * auVar43._4_4_;
                  auVar21._0_4_ = (float)local_2800._0_4_ * auVar43._0_4_;
                  auVar21._8_4_ = fStack_27f8 * auVar43._8_4_;
                  auVar21._12_4_ = fStack_27f4 * auVar43._12_4_;
                  auVar21._16_4_ = fStack_27f0 * auVar43._16_4_;
                  auVar21._20_4_ = fStack_27ec * auVar43._20_4_;
                  auVar21._24_4_ = fStack_27e8 * auVar43._24_4_;
                  auVar21._28_4_ = (int)((ulong)local_28e0._56_8_ >> 0x20);
                  uVar35 = *(undefined4 *)(root.ptr + 0x70 + uVar36 * 4);
                  auVar74._4_4_ = uVar35;
                  auVar74._0_4_ = uVar35;
                  auVar74._8_4_ = uVar35;
                  auVar74._12_4_ = uVar35;
                  auVar74._16_4_ = uVar35;
                  auVar74._20_4_ = uVar35;
                  auVar74._24_4_ = uVar35;
                  auVar74._28_4_ = uVar35;
                  auVar43 = vsubps_avx(auVar74,auVar27);
                  auVar22._4_4_ = (float)local_27e0._4_4_ * auVar43._4_4_;
                  auVar22._0_4_ = (float)local_27e0._0_4_ * auVar43._0_4_;
                  auVar22._8_4_ = fStack_27d8 * auVar43._8_4_;
                  auVar22._12_4_ = fStack_27d4 * auVar43._12_4_;
                  auVar22._16_4_ = fStack_27d0 * auVar43._16_4_;
                  auVar22._20_4_ = fStack_27cc * auVar43._20_4_;
                  auVar22._24_4_ = fStack_27c8 * auVar43._24_4_;
                  auVar22._28_4_ = (int)((ulong)local_28e0._88_8_ >> 0x20);
                  auVar43 = vminps_avx(auVar46,auVar20);
                  auVar44 = vminps_avx(auVar47,auVar21);
                  auVar43 = vmaxps_avx(auVar43,auVar44);
                  auVar44 = vminps_avx(auVar76,auVar22);
                  auVar43 = vmaxps_avx(auVar43,auVar44);
                  auVar45 = vmulps_avx512vl(auVar43,auVar105._0_32_);
                  auVar43 = vmaxps_avx(auVar46,auVar20);
                  auVar44 = vmaxps_avx(auVar47,auVar21);
                  auVar44 = vminps_avx(auVar43,auVar44);
                  auVar43 = vmaxps_avx(auVar76,auVar22);
                  auVar43 = vminps_avx(auVar44,auVar43);
                  auVar44 = vmulps_avx512vl(auVar43,auVar99._0_32_);
                  auVar43 = vmaxps_avx(auVar45,local_2760);
                  auVar44 = vminps_avx(auVar44,local_2740);
                  uVar14 = vcmpps_avx512vl(auVar43,auVar44,2);
                  if ((byte)uVar14 != 0) {
                    auVar43 = vblendmps_avx512vl(auVar104._0_32_,auVar45);
                    bVar40 = (bool)((byte)uVar14 & 1);
                    bVar6 = (bool)((byte)(uVar14 >> 1) & 1);
                    bVar7 = (bool)((byte)(uVar14 >> 2) & 1);
                    bVar8 = (bool)((byte)(uVar14 >> 3) & 1);
                    bVar9 = (bool)((byte)(uVar14 >> 4) & 1);
                    bVar10 = (bool)((byte)(uVar14 >> 5) & 1);
                    bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
                    bVar12 = SUB81(uVar14 >> 7,0);
                    if (uVar34 != 8) {
                      *puVar39 = uVar34;
                      puVar39 = puVar39 + 1;
                      *pauVar32 = auVar90._0_32_;
                      pauVar32 = pauVar32 + 1;
                    }
                    auVar90 = ZEXT3264(CONCAT428((uint)bVar12 * auVar43._28_4_ |
                                                 (uint)!bVar12 * auVar45._28_4_,
                                                 CONCAT424((uint)bVar11 * auVar43._24_4_ |
                                                           (uint)!bVar11 * auVar45._24_4_,
                                                           CONCAT420((uint)bVar10 * auVar43._20_4_ |
                                                                     (uint)!bVar10 * auVar45._20_4_,
                                                                     CONCAT416((uint)bVar9 *
                                                                               auVar43._16_4_ |
                                                                               (uint)!bVar9 *
                                                                               auVar45._16_4_,
                                                                               CONCAT412((uint)bVar8
                                                                                         * auVar43.
                                                  _12_4_ | (uint)!bVar8 * auVar45._12_4_,
                                                  CONCAT48((uint)bVar7 * auVar43._8_4_ |
                                                           (uint)!bVar7 * auVar45._8_4_,
                                                           CONCAT44((uint)bVar6 * auVar43._4_4_ |
                                                                    (uint)!bVar6 * auVar45._4_4_,
                                                                    (uint)bVar40 * auVar43._0_4_ |
                                                                    (uint)!bVar40 * auVar45._0_4_)))
                                                  )))));
                    uVar34 = uVar13;
                  }
                }
              } while ((uVar13 != 8) && (bVar40 = uVar36 < 3, uVar36 = uVar36 + 1, bVar40));
              iVar31 = 0;
              if (uVar34 == 8) {
LAB_007acf80:
                bVar40 = false;
                iVar31 = 4;
              }
              else {
                uVar15 = vcmpps_avx512vl(auVar90._0_32_,local_2740,9);
                bVar40 = true;
                if ((uint)POPCOUNT((int)uVar15) <= (uint)local_2ad0) {
                  *puVar39 = uVar34;
                  puVar39 = puVar39 + 1;
                  *pauVar32 = auVar90._0_32_;
                  pauVar32 = pauVar32 + 1;
                  goto LAB_007acf80;
                }
              }
              root.ptr = uVar34;
            } while (bVar40);
          }
        }
        goto LAB_007add79;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar41 = local_2ad8 + 1;
    lVar37 = lVar37 + 0x60;
    if (local_2a30 <= uVar41) break;
LAB_007acfcf:
    local_2a28 = context->scene;
    uVar36 = 0;
    bVar38 = bVar29;
    local_2ad8 = uVar41;
    while (*(int *)(lVar37 + uVar36 * 4) != -1) {
      uVar1 = *(uint *)(lVar37 + -0x10 + uVar36 * 4);
      pfVar2 = (local_2a28->vertices).items[uVar1];
      uVar41 = (ulong)*(uint *)(lVar37 + -0x50 + uVar36 * 4);
      uVar34 = (ulong)*(uint *)(lVar37 + -0x40 + uVar36 * 4);
      fVar89 = pfVar2[uVar41];
      auVar75._4_4_ = fVar89;
      auVar75._0_4_ = fVar89;
      auVar75._8_4_ = fVar89;
      auVar75._12_4_ = fVar89;
      auVar75._16_4_ = fVar89;
      auVar75._20_4_ = fVar89;
      auVar75._24_4_ = fVar89;
      auVar75._28_4_ = fVar89;
      fVar89 = pfVar2[uVar41 + 1];
      auVar78._4_4_ = fVar89;
      auVar78._0_4_ = fVar89;
      auVar78._8_4_ = fVar89;
      auVar78._12_4_ = fVar89;
      auVar78._16_4_ = fVar89;
      auVar78._20_4_ = fVar89;
      auVar78._24_4_ = fVar89;
      auVar78._28_4_ = fVar89;
      fVar89 = pfVar2[uVar41 + 2];
      auVar79._4_4_ = fVar89;
      auVar79._0_4_ = fVar89;
      auVar79._8_4_ = fVar89;
      auVar79._12_4_ = fVar89;
      auVar79._16_4_ = fVar89;
      auVar79._20_4_ = fVar89;
      auVar79._24_4_ = fVar89;
      auVar79._28_4_ = fVar89;
      fVar89 = pfVar2[uVar34];
      local_2a80._4_4_ = fVar89;
      local_2a80._0_4_ = fVar89;
      local_2a80._8_4_ = fVar89;
      local_2a80._12_4_ = fVar89;
      local_2a80._16_4_ = fVar89;
      local_2a80._20_4_ = fVar89;
      local_2a80._24_4_ = fVar89;
      local_2a80._28_4_ = fVar89;
      fVar89 = pfVar2[uVar34 + 1];
      local_2640._4_4_ = fVar89;
      local_2640._0_4_ = fVar89;
      local_2640._8_4_ = fVar89;
      local_2640._12_4_ = fVar89;
      local_2640._16_4_ = fVar89;
      local_2640._20_4_ = fVar89;
      local_2640._24_4_ = fVar89;
      local_2640._28_4_ = fVar89;
      local_2660 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar34 + 2]));
      uVar41 = (ulong)*(uint *)(lVar37 + -0x20 + uVar36 * 4);
      local_2680 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar41]));
      local_26a0 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar41 + 1]));
      local_26c0 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar41 + 2]));
      auVar43 = *(undefined1 (*) [32])ray;
      auVar44 = *(undefined1 (*) [32])(ray + 0x20);
      auVar45 = *(undefined1 (*) [32])(ray + 0x40);
      auVar46 = *(undefined1 (*) [32])(ray + 0x80);
      in_ZMM7 = ZEXT3264(auVar46);
      auVar47 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar76 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar75 = vsubps_avx(auVar75,auVar43);
      auVar78 = vsubps_avx(auVar78,auVar44);
      auVar79 = vsubps_avx(auVar79,auVar45);
      in_ZMM9 = ZEXT3264(auVar79);
      auVar62 = vsubps_avx(local_2a80,auVar43);
      auVar61 = vsubps_avx(local_2640,auVar44);
      auVar48 = vsubps_avx512vl(local_2660,auVar45);
      auVar49 = vsubps_avx512vl(local_2680,auVar43);
      auVar50 = vsubps_avx512vl(local_26a0,auVar44);
      auVar51 = vsubps_avx512vl(local_26c0,auVar45);
      auVar52 = vsubps_avx512vl(auVar49,auVar75);
      auVar53 = vsubps_avx512vl(auVar50,auVar78);
      auVar54 = vsubps_avx512vl(auVar51,auVar79);
      auVar55 = vsubps_avx512vl(auVar75,auVar62);
      auVar56 = vsubps_avx512vl(auVar78,auVar61);
      auVar57 = vsubps_avx512vl(auVar79,auVar48);
      auVar58 = vaddps_avx512vl(auVar49,auVar75);
      auVar59 = vaddps_avx512vl(auVar50,auVar78);
      auVar60 = vaddps_avx512vl(auVar51,auVar79);
      auVar44._4_4_ = auVar54._4_4_ * auVar59._4_4_;
      auVar44._0_4_ = auVar54._0_4_ * auVar59._0_4_;
      auVar44._8_4_ = auVar54._8_4_ * auVar59._8_4_;
      auVar44._12_4_ = auVar54._12_4_ * auVar59._12_4_;
      auVar44._16_4_ = auVar54._16_4_ * auVar59._16_4_;
      auVar44._20_4_ = auVar54._20_4_ * auVar59._20_4_;
      auVar44._24_4_ = auVar54._24_4_ * auVar59._24_4_;
      auVar44._28_4_ = auVar43._28_4_;
      auVar19 = vfmsub231ps_fma(auVar44,auVar53,auVar60);
      auVar45._4_4_ = auVar52._4_4_ * auVar60._4_4_;
      auVar45._0_4_ = auVar52._0_4_ * auVar60._0_4_;
      auVar45._8_4_ = auVar52._8_4_ * auVar60._8_4_;
      auVar45._12_4_ = auVar52._12_4_ * auVar60._12_4_;
      auVar45._16_4_ = auVar52._16_4_ * auVar60._16_4_;
      auVar45._20_4_ = auVar52._20_4_ * auVar60._20_4_;
      auVar45._24_4_ = auVar52._24_4_ * auVar60._24_4_;
      auVar45._28_4_ = auVar60._28_4_;
      auVar77 = vfmsub231ps_fma(auVar45,auVar54,auVar58);
      auVar60._4_4_ = auVar53._4_4_ * auVar58._4_4_;
      auVar60._0_4_ = auVar53._0_4_ * auVar58._0_4_;
      auVar60._8_4_ = auVar53._8_4_ * auVar58._8_4_;
      auVar60._12_4_ = auVar53._12_4_ * auVar58._12_4_;
      auVar60._16_4_ = auVar53._16_4_ * auVar58._16_4_;
      auVar60._20_4_ = auVar53._20_4_ * auVar58._20_4_;
      auVar60._24_4_ = auVar53._24_4_ * auVar58._24_4_;
      auVar60._28_4_ = auVar58._28_4_;
      auVar82 = vfmsub231ps_fma(auVar60,auVar52,auVar59);
      fVar89 = auVar76._0_4_;
      auVar59._0_4_ = fVar89 * auVar82._0_4_;
      fVar91 = auVar76._4_4_;
      auVar59._4_4_ = fVar91 * auVar82._4_4_;
      fVar92 = auVar76._8_4_;
      auVar59._8_4_ = fVar92 * auVar82._8_4_;
      fVar93 = auVar76._12_4_;
      auVar59._12_4_ = fVar93 * auVar82._12_4_;
      fVar94 = auVar76._16_4_;
      auVar59._16_4_ = fVar94 * 0.0;
      fVar95 = auVar76._20_4_;
      auVar59._20_4_ = fVar95 * 0.0;
      fVar96 = auVar76._24_4_;
      auVar59._24_4_ = fVar96 * 0.0;
      auVar59._28_4_ = 0;
      auVar77 = vfmadd231ps_fma(auVar59,auVar47,ZEXT1632(auVar77));
      auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar46,ZEXT1632(auVar19));
      auVar63._0_4_ = auVar62._0_4_ + auVar75._0_4_;
      auVar63._4_4_ = auVar62._4_4_ + auVar75._4_4_;
      auVar63._8_4_ = auVar62._8_4_ + auVar75._8_4_;
      auVar63._12_4_ = auVar62._12_4_ + auVar75._12_4_;
      auVar63._16_4_ = auVar62._16_4_ + auVar75._16_4_;
      auVar63._20_4_ = auVar62._20_4_ + auVar75._20_4_;
      auVar63._24_4_ = auVar62._24_4_ + auVar75._24_4_;
      auVar63._28_4_ = auVar62._28_4_ + auVar75._28_4_;
      auVar64._0_4_ = auVar61._0_4_ + auVar78._0_4_;
      auVar64._4_4_ = auVar61._4_4_ + auVar78._4_4_;
      auVar64._8_4_ = auVar61._8_4_ + auVar78._8_4_;
      auVar64._12_4_ = auVar61._12_4_ + auVar78._12_4_;
      auVar64._16_4_ = auVar61._16_4_ + auVar78._16_4_;
      auVar64._20_4_ = auVar61._20_4_ + auVar78._20_4_;
      auVar64._24_4_ = auVar61._24_4_ + auVar78._24_4_;
      auVar64._28_4_ = auVar61._28_4_ + auVar78._28_4_;
      auVar43 = vaddps_avx512vl(auVar79,auVar48);
      auVar44 = vmulps_avx512vl(auVar64,auVar57);
      auVar44 = vfmsub231ps_avx512vl(auVar44,auVar56,auVar43);
      auVar43 = vmulps_avx512vl(auVar43,auVar55);
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar57,auVar63);
      auVar45 = vmulps_avx512vl(auVar63,auVar56);
      auVar45 = vfmsub231ps_avx512vl(auVar45,auVar55,auVar64);
      auVar60 = vsubps_avx512vl(auVar62,auVar49);
      auVar58._4_4_ = fVar91 * auVar45._4_4_;
      auVar58._0_4_ = fVar89 * auVar45._0_4_;
      auVar58._8_4_ = fVar92 * auVar45._8_4_;
      auVar58._12_4_ = fVar93 * auVar45._12_4_;
      auVar58._16_4_ = fVar94 * auVar45._16_4_;
      auVar58._20_4_ = fVar95 * auVar45._20_4_;
      auVar58._24_4_ = fVar96 * auVar45._24_4_;
      auVar58._28_4_ = auVar45._28_4_;
      auVar43 = vfmadd231ps_avx512vl(auVar58,auVar47,auVar43);
      auVar45 = vsubps_avx512vl(auVar61,auVar50);
      auVar19 = vfmadd231ps_fma(auVar43,auVar46,auVar44);
      auVar44 = vsubps_avx512vl(auVar48,auVar51);
      auVar83 = ZEXT3264(auVar44);
      auVar43 = vaddps_avx512vl(auVar62,auVar49);
      auVar61 = vaddps_avx512vl(auVar61,auVar50);
      auVar62 = vaddps_avx512vl(auVar48,auVar51);
      auVar58 = vmulps_avx512vl(auVar61,auVar44);
      auVar58 = vfmsub231ps_avx512vl(auVar58,auVar45,auVar62);
      auVar62 = vmulps_avx512vl(auVar62,auVar60);
      auVar48 = vfmsub231ps_avx512vl(auVar62,auVar44,auVar43);
      auVar62._4_4_ = auVar43._4_4_ * auVar45._4_4_;
      auVar62._0_4_ = auVar43._0_4_ * auVar45._0_4_;
      auVar62._8_4_ = auVar43._8_4_ * auVar45._8_4_;
      auVar62._12_4_ = auVar43._12_4_ * auVar45._12_4_;
      auVar62._16_4_ = auVar43._16_4_ * auVar45._16_4_;
      auVar62._20_4_ = auVar43._20_4_ * auVar45._20_4_;
      auVar62._24_4_ = auVar43._24_4_ * auVar45._24_4_;
      auVar62._28_4_ = auVar43._28_4_;
      auVar82 = vfmsub231ps_fma(auVar62,auVar60,auVar61);
      auVar43 = vmulps_avx512vl(ZEXT1632(auVar82),auVar76);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar47,auVar48);
      auVar62 = vfmadd231ps_avx512vl(auVar43,auVar46,auVar58);
      auVar61 = vaddps_avx512vl(auVar62,ZEXT1632(CONCAT412(auVar77._12_4_ + auVar19._12_4_,
                                                           CONCAT48(auVar77._8_4_ + auVar19._8_4_,
                                                                    CONCAT44(auVar77._4_4_ +
                                                                             auVar19._4_4_,
                                                                             auVar77._0_4_ +
                                                                             auVar19._0_4_)))));
      auVar49 = auVar100._0_32_;
      vandps_avx512vl(auVar61,auVar49);
      auVar43._8_4_ = 0x34000000;
      auVar43._0_8_ = 0x3400000034000000;
      auVar43._12_4_ = 0x34000000;
      auVar43._16_4_ = 0x34000000;
      auVar43._20_4_ = 0x34000000;
      auVar43._24_4_ = 0x34000000;
      auVar43._28_4_ = 0x34000000;
      auVar43 = vmulps_avx512vl(auVar61,auVar43);
      auVar58 = vminps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar19));
      auVar58 = vminps_avx512vl(auVar58,auVar62);
      auVar48 = vxorps_avx512vl(auVar43,auVar98._0_32_);
      uVar15 = vcmpps_avx512vl(auVar58,auVar48,5);
      uVar41 = (ulong)*(uint *)(lVar37 + -0x30 + uVar36 * 4);
      auVar58 = vmaxps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar19));
      auVar62 = vmaxps_avx512vl(auVar58,auVar62);
      local_26e0 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar41]));
      uVar16 = vcmpps_avx512vl(auVar62,auVar43,2);
      local_2700 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar41 + 1]));
      local_2720 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar2[uVar41 + 2]));
      bVar33 = ((byte)uVar15 | (byte)uVar16) & bVar38;
      if (bVar33 != 0) {
        auVar43 = vmulps_avx512vl(auVar56,auVar54);
        auVar62 = vmulps_avx512vl(auVar52,auVar57);
        auVar58 = vmulps_avx512vl(auVar55,auVar53);
        auVar48 = vmulps_avx512vl(auVar45,auVar57);
        auVar50 = vmulps_avx512vl(auVar55,auVar44);
        auVar51 = vmulps_avx512vl(auVar60,auVar56);
        auVar53 = vfmsub213ps_avx512vl(auVar53,auVar57,auVar43);
        auVar54 = vfmsub213ps_avx512vl(auVar54,auVar55,auVar62);
        auVar52 = vfmsub213ps_avx512vl(auVar52,auVar56,auVar58);
        auVar44 = vfmsub213ps_avx512vl(auVar44,auVar56,auVar48);
        auVar60 = vfmsub213ps_avx512vl(auVar60,auVar57,auVar50);
        auVar45 = vfmsub213ps_avx512vl(auVar45,auVar55,auVar51);
        vandps_avx512vl(auVar43,auVar49);
        vandps_avx512vl(auVar48,auVar49);
        uVar41 = vcmpps_avx512vl(auVar45,auVar45,1);
        vandps_avx512vl(auVar62,auVar49);
        vandps_avx512vl(auVar50,auVar49);
        uVar34 = vcmpps_avx512vl(auVar45,auVar45,1);
        vandps_avx512vl(auVar58,auVar49);
        vandps_avx512vl(auVar51,auVar49);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar98 = ZEXT3264(auVar43);
        uVar13 = vcmpps_avx512vl(auVar45,auVar45,1);
        bVar40 = (bool)((byte)uVar41 & 1);
        auVar42._0_4_ = (uint)bVar40 * auVar53._0_4_ | (uint)!bVar40 * auVar44._0_4_;
        bVar40 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar42._4_4_ = (uint)bVar40 * auVar53._4_4_ | (uint)!bVar40 * auVar44._4_4_;
        bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar42._8_4_ = (uint)bVar40 * auVar53._8_4_ | (uint)!bVar40 * auVar44._8_4_;
        bVar40 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar42._12_4_ = (uint)bVar40 * auVar53._12_4_ | (uint)!bVar40 * auVar44._12_4_;
        bVar40 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar49._16_4_ = (uint)bVar40 * auVar53._16_4_ | (uint)!bVar40 * auVar44._16_4_;
        auVar49._0_16_ = auVar42;
        bVar40 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar49._20_4_ = (uint)bVar40 * auVar53._20_4_ | (uint)!bVar40 * auVar44._20_4_;
        bVar40 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar49._24_4_ = (uint)bVar40 * auVar53._24_4_ | (uint)!bVar40 * auVar44._24_4_;
        bVar40 = SUB81(uVar41 >> 7,0);
        auVar49._28_4_ = (uint)bVar40 * auVar53._28_4_ | (uint)!bVar40 * auVar44._28_4_;
        auVar83 = ZEXT3264(auVar49);
        bVar40 = (bool)((byte)uVar34 & 1);
        auVar50._0_4_ = (uint)bVar40 * auVar54._0_4_ | (uint)!bVar40 * auVar60._0_4_;
        bVar40 = (bool)((byte)(uVar34 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar40 * auVar54._4_4_ | (uint)!bVar40 * auVar60._4_4_;
        bVar40 = (bool)((byte)(uVar34 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar40 * auVar54._8_4_ | (uint)!bVar40 * auVar60._8_4_;
        bVar40 = (bool)((byte)(uVar34 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar40 * auVar54._12_4_ | (uint)!bVar40 * auVar60._12_4_;
        bVar40 = (bool)((byte)(uVar34 >> 4) & 1);
        auVar50._16_4_ = (uint)bVar40 * auVar54._16_4_ | (uint)!bVar40 * auVar60._16_4_;
        bVar40 = (bool)((byte)(uVar34 >> 5) & 1);
        auVar50._20_4_ = (uint)bVar40 * auVar54._20_4_ | (uint)!bVar40 * auVar60._20_4_;
        bVar40 = (bool)((byte)(uVar34 >> 6) & 1);
        auVar50._24_4_ = (uint)bVar40 * auVar54._24_4_ | (uint)!bVar40 * auVar60._24_4_;
        bVar40 = SUB81(uVar34 >> 7,0);
        auVar50._28_4_ = (uint)bVar40 * auVar54._28_4_ | (uint)!bVar40 * auVar60._28_4_;
        bVar40 = (bool)((byte)uVar13 & 1);
        auVar51._0_4_ = (float)((uint)bVar40 * auVar52._0_4_ | (uint)!bVar40 * auVar45._0_4_);
        bVar40 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar51._4_4_ = (float)((uint)bVar40 * auVar52._4_4_ | (uint)!bVar40 * auVar45._4_4_);
        bVar40 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar51._8_4_ = (float)((uint)bVar40 * auVar52._8_4_ | (uint)!bVar40 * auVar45._8_4_);
        bVar40 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar51._12_4_ = (float)((uint)bVar40 * auVar52._12_4_ | (uint)!bVar40 * auVar45._12_4_);
        bVar40 = (bool)((byte)(uVar13 >> 4) & 1);
        auVar51._16_4_ = (float)((uint)bVar40 * auVar52._16_4_ | (uint)!bVar40 * auVar45._16_4_);
        bVar40 = (bool)((byte)(uVar13 >> 5) & 1);
        auVar51._20_4_ = (float)((uint)bVar40 * auVar52._20_4_ | (uint)!bVar40 * auVar45._20_4_);
        bVar40 = (bool)((byte)(uVar13 >> 6) & 1);
        auVar51._24_4_ = (float)((uint)bVar40 * auVar52._24_4_ | (uint)!bVar40 * auVar45._24_4_);
        bVar40 = SUB81(uVar13 >> 7,0);
        auVar51._28_4_ = (uint)bVar40 * auVar52._28_4_ | (uint)!bVar40 * auVar45._28_4_;
        auVar48._4_4_ = fVar91 * auVar51._4_4_;
        auVar48._0_4_ = fVar89 * auVar51._0_4_;
        auVar48._8_4_ = fVar92 * auVar51._8_4_;
        auVar48._12_4_ = fVar93 * auVar51._12_4_;
        auVar48._16_4_ = fVar94 * auVar51._16_4_;
        auVar48._20_4_ = fVar95 * auVar51._20_4_;
        auVar48._24_4_ = fVar96 * auVar51._24_4_;
        auVar48._28_4_ = auVar76._28_4_;
        auVar82 = vfmadd213ps_fma(auVar47,auVar50,auVar48);
        auVar82 = vfmadd213ps_fma(auVar46,auVar49,ZEXT1632(auVar82));
        auVar46 = ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                     CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                              CONCAT44(auVar82._4_4_ + auVar82._4_4_,
                                                       auVar82._0_4_ + auVar82._0_4_))));
        in_ZMM7 = ZEXT3264(auVar46);
        auVar47._0_4_ = auVar79._0_4_ * auVar51._0_4_;
        auVar47._4_4_ = auVar79._4_4_ * auVar51._4_4_;
        auVar47._8_4_ = auVar79._8_4_ * auVar51._8_4_;
        auVar47._12_4_ = auVar79._12_4_ * auVar51._12_4_;
        auVar47._16_4_ = auVar79._16_4_ * auVar51._16_4_;
        auVar47._20_4_ = auVar79._20_4_ * auVar51._20_4_;
        auVar47._24_4_ = auVar79._24_4_ * auVar51._24_4_;
        auVar47._28_4_ = 0;
        auVar82 = vfmadd213ps_fma(auVar78,auVar50,auVar47);
        auVar18 = vfmadd213ps_fma(auVar75,auVar49,ZEXT1632(auVar82));
        auVar44 = vrcp14ps_avx512vl(auVar46);
        auVar45 = vxorps_avx512vl(auVar46,auVar43);
        auVar47 = auVar102._0_32_;
        auVar43 = vfnmadd213ps_avx512vl(auVar44,auVar46,auVar47);
        auVar82 = vfmadd132ps_fma(auVar43,auVar44,auVar44);
        in_ZMM9 = ZEXT1664(auVar82);
        auVar43 = *(undefined1 (*) [32])(ray + 0x100);
        auVar44 = ZEXT1632(CONCAT412(auVar82._12_4_ * (auVar18._12_4_ + auVar18._12_4_),
                                     CONCAT48(auVar82._8_4_ * (auVar18._8_4_ + auVar18._8_4_),
                                              CONCAT44(auVar82._4_4_ *
                                                       (auVar18._4_4_ + auVar18._4_4_),
                                                       auVar82._0_4_ *
                                                       (auVar18._0_4_ + auVar18._0_4_)))));
        uVar15 = vcmpps_avx512vl(auVar44,auVar43,2);
        uVar16 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar17 = vcmpps_avx512vl(auVar46,auVar45,4);
        bVar33 = bVar33 & (byte)uVar15 & (byte)uVar16 & (byte)uVar17;
        if (bVar33 != 0) {
          pGVar3 = (context->scene->geometries).items[uVar1].ptr;
          uVar1 = pGVar3->mask;
          auVar46._4_4_ = uVar1;
          auVar46._0_4_ = uVar1;
          auVar46._8_4_ = uVar1;
          auVar46._12_4_ = uVar1;
          auVar46._16_4_ = uVar1;
          auVar46._20_4_ = uVar1;
          auVar46._24_4_ = uVar1;
          auVar46._28_4_ = uVar1;
          uVar15 = vptestmd_avx512vl(auVar46,*(undefined1 (*) [32])(ray + 0x120));
          bVar33 = bVar33 & (byte)uVar15;
          uVar41 = (ulong)bVar33;
          if (bVar33 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar34 = vcmpps_avx512vl(auVar61,auVar101._0_32_,5);
              auVar45 = vrcp14ps_avx512vl(auVar61);
              auVar46 = vfnmadd213ps_avx512vl(auVar61,auVar45,auVar47);
              auVar45 = vfmadd132ps_avx512vl(auVar46,auVar45,auVar45);
              fVar91 = (float)((uint)((byte)uVar34 & 1) * auVar45._0_4_);
              fVar89 = (float)((uint)((byte)(uVar34 >> 1) & 1) * auVar45._4_4_);
              fVar92 = (float)((uint)((byte)(uVar34 >> 2) & 1) * auVar45._8_4_);
              fVar93 = (float)((uint)((byte)(uVar34 >> 3) & 1) * auVar45._12_4_);
              fVar94 = (float)((uint)((byte)(uVar34 >> 4) & 1) * auVar45._16_4_);
              fVar95 = (float)((uint)((byte)(uVar34 >> 5) & 1) * auVar45._20_4_);
              fVar96 = (float)((uint)((byte)(uVar34 >> 6) & 1) * auVar45._24_4_);
              auVar76._0_4_ = fVar91 * auVar77._0_4_;
              auVar76._4_4_ = fVar89 * auVar77._4_4_;
              auVar76._8_4_ = fVar92 * auVar77._8_4_;
              auVar76._12_4_ = fVar93 * auVar77._12_4_;
              auVar76._16_4_ = fVar94 * 0.0;
              auVar76._20_4_ = fVar95 * 0.0;
              auVar76._24_4_ = fVar96 * 0.0;
              auVar76._28_4_ = 0;
              local_29a0 = vminps_avx512vl(auVar76,auVar47);
              auVar61._0_4_ = fVar91 * auVar19._0_4_;
              auVar61._4_4_ = fVar89 * auVar19._4_4_;
              auVar61._8_4_ = fVar92 * auVar19._8_4_;
              auVar61._12_4_ = fVar93 * auVar19._12_4_;
              auVar61._16_4_ = fVar94 * 0.0;
              auVar61._20_4_ = fVar95 * 0.0;
              auVar61._24_4_ = fVar96 * 0.0;
              auVar61._28_4_ = 0;
              local_2980 = vminps_avx512vl(auVar61,auVar47);
              pRVar4 = context->user;
              local_2940 = vpbroadcastd_avx512vl();
              local_2960 = vpbroadcastd_avx512vl();
              in_ZMM7 = ZEXT3264(local_2960);
              auVar45 = vpcmpeqd_avx2(local_29a0,local_29a0);
              local_2ab8[1] = auVar45;
              *local_2ab8 = auVar45;
              local_2920 = pRVar4->instID[0];
              local_2900 = pRVar4->instPrimID[0];
              auVar44 = vblendmps_avx512vl(auVar43,auVar44);
              bVar40 = (bool)(bVar33 >> 1 & 1);
              bVar6 = (bool)(bVar33 >> 2 & 1);
              bVar7 = (bool)(bVar33 >> 3 & 1);
              bVar8 = (bool)(bVar33 >> 4 & 1);
              bVar9 = (bool)(bVar33 >> 5 & 1);
              bVar10 = (bool)(bVar33 >> 6 & 1);
              *(uint *)(ray + 0x100) =
                   (uint)(bVar33 & 1) * auVar44._0_4_ | !(bool)(bVar33 & 1) * local_2900;
              *(uint *)(ray + 0x104) = (uint)bVar40 * auVar44._4_4_ | !bVar40 * local_2900;
              *(uint *)(ray + 0x108) = (uint)bVar6 * auVar44._8_4_ | !bVar6 * local_2900;
              *(uint *)(ray + 0x10c) = (uint)bVar7 * auVar44._12_4_ | !bVar7 * local_2900;
              *(uint *)(ray + 0x110) = (uint)bVar8 * auVar44._16_4_ | !bVar8 * local_2900;
              *(uint *)(ray + 0x114) = (uint)bVar9 * auVar44._20_4_ | !bVar9 * local_2900;
              *(uint *)(ray + 0x118) = (uint)bVar10 * auVar44._24_4_ | !bVar10 * local_2900;
              *(uint *)(ray + 0x11c) =
                   (uint)(bVar33 >> 7) * auVar44._28_4_ | !(bool)(bVar33 >> 7) * local_2900;
              local_2a60 = vpmovm2d_avx512vl(uVar41);
              local_2ab0.valid = (int *)local_2a60;
              local_2ab0.geometryUserPtr = pGVar3->userPtr;
              local_2ab0.context = context->user;
              local_2ab0.hit = local_2a00;
              local_2ab0.N = 8;
              local_2ab0.ray = (RTCRayN *)ray;
              local_2a20 = auVar43;
              local_2a00 = (RTCHitN  [32])auVar49;
              local_29e0 = auVar50;
              local_29c0 = auVar51;
              uStack_291c = local_2920;
              uStack_2918 = local_2920;
              uStack_2914 = local_2920;
              uStack_2910 = local_2920;
              uStack_290c = local_2920;
              uStack_2908 = local_2920;
              uStack_2904 = local_2920;
              uStack_28fc = local_2900;
              uStack_28f8 = local_2900;
              uStack_28f4 = local_2900;
              uStack_28f0 = local_2900;
              uStack_28ec = local_2900;
              uStack_28e8 = local_2900;
              uStack_28e4 = local_2900;
              if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar83 = ZEXT1664(auVar42);
                in_ZMM7 = ZEXT1664(local_2960._0_16_);
                in_ZMM9 = ZEXT1664(auVar82);
                local_2ae0 = ray;
                (*pGVar3->occlusionFilterN)(&local_2ab0);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar98 = ZEXT3264(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar99 = ZEXT3264(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar105 = ZEXT3264(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar104 = ZEXT3264(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                auVar103 = ZEXT3264(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar102 = ZEXT3264(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar101 = ZEXT3264(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar100 = ZEXT3264(auVar43);
                ray = local_2ae0;
              }
              uVar41 = vptestmd_avx512vl(local_2a60,local_2a60);
              if ((char)uVar41 != '\0') {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar83 = ZEXT1664(auVar83._0_16_);
                  in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                  (*p_Var5)(&local_2ab0);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar98 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar99 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar105 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar104 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  auVar103 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar102 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                  auVar101 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar100 = ZEXT3264(auVar43);
                }
                uVar41 = vptestmd_avx512vl(local_2a60,local_2a60);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar40 = (bool)((byte)uVar41 & 1);
                auVar52._0_4_ =
                     (uint)bVar40 * auVar43._0_4_ | (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x100)
                ;
                bVar40 = (bool)((byte)(uVar41 >> 1) & 1);
                auVar52._4_4_ =
                     (uint)bVar40 * auVar43._4_4_ | (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x104)
                ;
                bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
                auVar52._8_4_ =
                     (uint)bVar40 * auVar43._8_4_ | (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x108)
                ;
                bVar40 = (bool)((byte)(uVar41 >> 3) & 1);
                auVar52._12_4_ =
                     (uint)bVar40 * auVar43._12_4_ |
                     (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x10c);
                bVar40 = (bool)((byte)(uVar41 >> 4) & 1);
                auVar52._16_4_ =
                     (uint)bVar40 * auVar43._16_4_ |
                     (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x110);
                bVar40 = (bool)((byte)(uVar41 >> 5) & 1);
                auVar52._20_4_ =
                     (uint)bVar40 * auVar43._20_4_ |
                     (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x114);
                bVar40 = (bool)((byte)(uVar41 >> 6) & 1);
                auVar52._24_4_ =
                     (uint)bVar40 * auVar43._24_4_ |
                     (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x118);
                bVar40 = SUB81(uVar41 >> 7,0);
                auVar52._28_4_ =
                     (uint)bVar40 * auVar43._28_4_ |
                     (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x11c);
                *(undefined1 (*) [32])(local_2ab0.ray + 0x100) = auVar52;
              }
              bVar40 = (bool)((byte)uVar41 & 1);
              bVar6 = (bool)((byte)(uVar41 >> 1) & 1);
              bVar7 = (bool)((byte)(uVar41 >> 2) & 1);
              bVar8 = (bool)((byte)(uVar41 >> 3) & 1);
              bVar9 = (bool)((byte)(uVar41 >> 4) & 1);
              bVar10 = (bool)((byte)(uVar41 >> 5) & 1);
              bVar11 = (bool)((byte)(uVar41 >> 6) & 1);
              bVar12 = SUB81(uVar41 >> 7,0);
              *(uint *)local_2ac8 =
                   (uint)bVar40 * *(int *)local_2ac8 | (uint)!bVar40 * local_2a20._0_4_;
              *(uint *)(local_2ac8 + 4) =
                   (uint)bVar6 * *(int *)(local_2ac8 + 4) | (uint)!bVar6 * local_2a20._4_4_;
              *(uint *)(local_2ac8 + 8) =
                   (uint)bVar7 * *(int *)(local_2ac8 + 8) | (uint)!bVar7 * local_2a20._8_4_;
              *(uint *)(local_2ac8 + 0xc) =
                   (uint)bVar8 * *(int *)(local_2ac8 + 0xc) | (uint)!bVar8 * local_2a20._12_4_;
              *(uint *)(local_2ac8 + 0x10) =
                   (uint)bVar9 * *(int *)(local_2ac8 + 0x10) | (uint)!bVar9 * local_2a20._16_4_;
              *(uint *)(local_2ac8 + 0x14) =
                   (uint)bVar10 * *(int *)(local_2ac8 + 0x14) | (uint)!bVar10 * local_2a20._20_4_;
              *(uint *)(local_2ac8 + 0x18) =
                   (uint)bVar11 * *(int *)(local_2ac8 + 0x18) | (uint)!bVar11 * local_2a20._24_4_;
              *(uint *)(local_2ac8 + 0x1c) =
                   (uint)bVar12 * *(int *)(local_2ac8 + 0x1c) | (uint)!bVar12 * local_2a20._28_4_;
            }
            bVar38 = bVar38 & ~(byte)uVar41;
          }
        }
      }
      if (bVar38 == 0) {
        bVar40 = false;
      }
      else {
        auVar43 = *(undefined1 (*) [32])ray;
        auVar44 = *(undefined1 (*) [32])(ray + 0x20);
        auVar45 = *(undefined1 (*) [32])(ray + 0x40);
        auVar46 = *(undefined1 (*) [32])(ray + 0x80);
        in_ZMM7 = ZEXT3264(auVar46);
        auVar47 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar76 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar75 = vsubps_avx(local_26e0,auVar43);
        auVar83 = ZEXT3264(auVar75);
        auVar78 = vsubps_avx(local_2700,auVar44);
        auVar79 = vsubps_avx(local_2720,auVar45);
        in_ZMM9 = ZEXT3264(auVar79);
        auVar62 = vsubps_avx(local_2680,auVar43);
        auVar61 = vsubps_avx(local_26a0,auVar44);
        auVar60 = vsubps_avx512vl(local_26c0,auVar45);
        auVar43 = vsubps_avx512vl(local_2a80,auVar43);
        auVar44 = vsubps_avx512vl(local_2640,auVar44);
        auVar45 = vsubps_avx512vl(local_2660,auVar45);
        auVar58 = vsubps_avx512vl(auVar43,auVar75);
        auVar48 = vsubps_avx512vl(auVar44,auVar78);
        auVar49 = vsubps_avx512vl(auVar45,auVar79);
        auVar50 = vsubps_avx512vl(auVar75,auVar62);
        auVar51 = vsubps_avx512vl(auVar78,auVar61);
        auVar52 = vsubps_avx512vl(auVar79,auVar60);
        auVar57 = vsubps_avx512vl(auVar62,auVar43);
        auVar59 = vsubps_avx512vl(auVar61,auVar44);
        auVar63 = vsubps_avx512vl(auVar60,auVar45);
        auVar53 = vaddps_avx512vl(auVar43,auVar75);
        auVar55 = vaddps_avx512vl(auVar44,auVar78);
        auVar54 = vaddps_avx512vl(auVar45,auVar79);
        auVar56 = vmulps_avx512vl(auVar55,auVar49);
        auVar56 = vfmsub231ps_avx512vl(auVar56,auVar48,auVar54);
        auVar54 = vmulps_avx512vl(auVar54,auVar58);
        auVar64 = vfmsub231ps_avx512vl(auVar54,auVar49,auVar53);
        auVar54._4_4_ = auVar48._4_4_ * auVar53._4_4_;
        auVar54._0_4_ = auVar48._0_4_ * auVar53._0_4_;
        auVar54._8_4_ = auVar48._8_4_ * auVar53._8_4_;
        auVar54._12_4_ = auVar48._12_4_ * auVar53._12_4_;
        auVar54._16_4_ = auVar48._16_4_ * auVar53._16_4_;
        auVar54._20_4_ = auVar48._20_4_ * auVar53._20_4_;
        auVar54._24_4_ = auVar48._24_4_ * auVar53._24_4_;
        auVar54._28_4_ = auVar53._28_4_;
        auVar77 = vfmsub231ps_fma(auVar54,auVar58,auVar55);
        fVar89 = auVar76._0_4_;
        auVar80._0_4_ = fVar89 * auVar77._0_4_;
        fVar91 = auVar76._4_4_;
        auVar80._4_4_ = fVar91 * auVar77._4_4_;
        fVar92 = auVar76._8_4_;
        auVar80._8_4_ = fVar92 * auVar77._8_4_;
        fVar93 = auVar76._12_4_;
        auVar80._12_4_ = fVar93 * auVar77._12_4_;
        fVar94 = auVar76._16_4_;
        auVar80._16_4_ = fVar94 * 0.0;
        fVar95 = auVar76._20_4_;
        auVar80._20_4_ = fVar95 * 0.0;
        fVar96 = auVar76._24_4_;
        auVar80._24_4_ = fVar96 * 0.0;
        auVar80._28_4_ = 0;
        auVar53 = vfmadd231ps_avx512vl(auVar80,auVar47,auVar64);
        auVar54 = vfmadd231ps_avx512vl(auVar53,auVar46,auVar56);
        auVar81._0_4_ = auVar62._0_4_ + auVar75._0_4_;
        auVar81._4_4_ = auVar62._4_4_ + auVar75._4_4_;
        auVar81._8_4_ = auVar62._8_4_ + auVar75._8_4_;
        auVar81._12_4_ = auVar62._12_4_ + auVar75._12_4_;
        auVar81._16_4_ = auVar62._16_4_ + auVar75._16_4_;
        auVar81._20_4_ = auVar62._20_4_ + auVar75._20_4_;
        auVar81._24_4_ = auVar62._24_4_ + auVar75._24_4_;
        auVar81._28_4_ = auVar62._28_4_ + auVar75._28_4_;
        auVar53 = vaddps_avx512vl(auVar78,auVar61);
        auVar55 = vaddps_avx512vl(auVar79,auVar60);
        auVar56 = vmulps_avx512vl(auVar53,auVar52);
        auVar56 = vfmsub231ps_avx512vl(auVar56,auVar51,auVar55);
        auVar55 = vmulps_avx512vl(auVar55,auVar50);
        auVar64 = vfmsub231ps_avx512vl(auVar55,auVar52,auVar81);
        auVar55 = vmulps_avx512vl(auVar81,auVar51);
        auVar53 = vfmsub231ps_avx512vl(auVar55,auVar50,auVar53);
        auVar55._4_4_ = fVar91 * auVar53._4_4_;
        auVar55._0_4_ = fVar89 * auVar53._0_4_;
        auVar55._8_4_ = fVar92 * auVar53._8_4_;
        auVar55._12_4_ = fVar93 * auVar53._12_4_;
        auVar55._16_4_ = fVar94 * auVar53._16_4_;
        auVar55._20_4_ = fVar95 * auVar53._20_4_;
        auVar55._24_4_ = fVar96 * auVar53._24_4_;
        auVar55._28_4_ = auVar53._28_4_;
        auVar53 = vfmadd231ps_avx512vl(auVar55,auVar47,auVar64);
        auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar98 = ZEXT3264(auVar55);
        auVar64 = vfmadd231ps_avx512vl(auVar53,auVar46,auVar56);
        auVar43 = vaddps_avx512vl(auVar62,auVar43);
        auVar44 = vaddps_avx512vl(auVar61,auVar44);
        auVar45 = vaddps_avx512vl(auVar60,auVar45);
        auVar62 = vmulps_avx512vl(auVar44,auVar63);
        auVar62 = vfmsub231ps_avx512vl(auVar62,auVar59,auVar45);
        auVar45 = vmulps_avx512vl(auVar45,auVar57);
        auVar45 = vfmsub231ps_avx512vl(auVar45,auVar63,auVar43);
        auVar56._4_4_ = auVar43._4_4_ * auVar59._4_4_;
        auVar56._0_4_ = auVar43._0_4_ * auVar59._0_4_;
        auVar56._8_4_ = auVar43._8_4_ * auVar59._8_4_;
        auVar56._12_4_ = auVar43._12_4_ * auVar59._12_4_;
        auVar56._16_4_ = auVar43._16_4_ * auVar59._16_4_;
        auVar56._20_4_ = auVar43._20_4_ * auVar59._20_4_;
        auVar56._24_4_ = auVar43._24_4_ * auVar59._24_4_;
        auVar56._28_4_ = auVar43._28_4_;
        auVar77 = vfmsub231ps_fma(auVar56,auVar57,auVar44);
        auVar43 = vmulps_avx512vl(ZEXT1632(auVar77),auVar76);
        auVar43 = vfmadd231ps_avx512vl(auVar43,auVar47,auVar45);
        auVar43 = vfmadd231ps_avx512vl(auVar43,auVar46,auVar62);
        auVar97._0_4_ = auVar54._0_4_ + auVar64._0_4_;
        auVar97._4_4_ = auVar54._4_4_ + auVar64._4_4_;
        auVar97._8_4_ = auVar54._8_4_ + auVar64._8_4_;
        auVar97._12_4_ = auVar54._12_4_ + auVar64._12_4_;
        auVar97._16_4_ = auVar54._16_4_ + auVar64._16_4_;
        auVar97._20_4_ = auVar54._20_4_ + auVar64._20_4_;
        auVar97._24_4_ = auVar54._24_4_ + auVar64._24_4_;
        auVar97._28_4_ = auVar54._28_4_ + auVar64._28_4_;
        auVar44 = vaddps_avx512vl(auVar43,auVar97);
        auVar60 = auVar100._0_32_;
        vandps_avx512vl(auVar44,auVar60);
        auVar53._8_4_ = 0x34000000;
        auVar53._0_8_ = 0x3400000034000000;
        auVar53._12_4_ = 0x34000000;
        auVar53._16_4_ = 0x34000000;
        auVar53._20_4_ = 0x34000000;
        auVar53._24_4_ = 0x34000000;
        auVar53._28_4_ = 0x34000000;
        auVar45 = vmulps_avx512vl(auVar44,auVar53);
        auVar62 = vminps_avx512vl(auVar54,auVar64);
        auVar62 = vminps_avx512vl(auVar62,auVar43);
        auVar61 = vxorps_avx512vl(auVar45,auVar55);
        uVar15 = vcmpps_avx512vl(auVar62,auVar61,5);
        auVar62 = vmaxps_avx512vl(auVar54,auVar64);
        auVar43 = vmaxps_avx512vl(auVar62,auVar43);
        uVar16 = vcmpps_avx512vl(auVar43,auVar45,2);
        bVar33 = ((byte)uVar15 | (byte)uVar16) & bVar38;
        if (bVar33 == 0) {
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar99 = ZEXT3264(auVar43);
        }
        else {
          auVar43 = vmulps_avx512vl(auVar51,auVar49);
          auVar45 = vmulps_avx512vl(auVar58,auVar52);
          auVar62 = vmulps_avx512vl(auVar50,auVar48);
          auVar61 = vmulps_avx512vl(auVar59,auVar52);
          auVar53 = vmulps_avx512vl(auVar50,auVar63);
          auVar55 = vmulps_avx512vl(auVar57,auVar51);
          auVar48 = vfmsub213ps_avx512vl(auVar48,auVar52,auVar43);
          auVar49 = vfmsub213ps_avx512vl(auVar49,auVar50,auVar45);
          auVar58 = vfmsub213ps_avx512vl(auVar58,auVar51,auVar62);
          auVar51 = vfmsub213ps_avx512vl(auVar63,auVar51,auVar61);
          auVar52 = vfmsub213ps_avx512vl(auVar57,auVar52,auVar53);
          auVar50 = vfmsub213ps_avx512vl(auVar59,auVar50,auVar55);
          vandps_avx512vl(auVar43,auVar60);
          vandps_avx512vl(auVar61,auVar60);
          uVar41 = vcmpps_avx512vl(auVar50,auVar50,1);
          vandps_avx512vl(auVar45,auVar60);
          vandps_avx512vl(auVar53,auVar60);
          uVar34 = vcmpps_avx512vl(auVar50,auVar50,1);
          vandps_avx512vl(auVar62,auVar60);
          vandps_avx512vl(auVar55,auVar60);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar98 = ZEXT3264(auVar43);
          uVar13 = vcmpps_avx512vl(auVar50,auVar50,1);
          bVar40 = (bool)((byte)uVar41 & 1);
          auVar65._0_4_ = (uint)bVar40 * auVar48._0_4_ | (uint)!bVar40 * auVar51._0_4_;
          bVar40 = (bool)((byte)(uVar41 >> 1) & 1);
          auVar65._4_4_ = (uint)bVar40 * auVar48._4_4_ | (uint)!bVar40 * auVar51._4_4_;
          bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
          auVar65._8_4_ = (uint)bVar40 * auVar48._8_4_ | (uint)!bVar40 * auVar51._8_4_;
          bVar40 = (bool)((byte)(uVar41 >> 3) & 1);
          auVar65._12_4_ = (uint)bVar40 * auVar48._12_4_ | (uint)!bVar40 * auVar51._12_4_;
          bVar40 = (bool)((byte)(uVar41 >> 4) & 1);
          auVar65._16_4_ = (uint)bVar40 * auVar48._16_4_ | (uint)!bVar40 * auVar51._16_4_;
          bVar40 = (bool)((byte)(uVar41 >> 5) & 1);
          auVar65._20_4_ = (uint)bVar40 * auVar48._20_4_ | (uint)!bVar40 * auVar51._20_4_;
          bVar40 = (bool)((byte)(uVar41 >> 6) & 1);
          auVar65._24_4_ = (uint)bVar40 * auVar48._24_4_ | (uint)!bVar40 * auVar51._24_4_;
          bVar40 = SUB81(uVar41 >> 7,0);
          auVar65._28_4_ = (uint)bVar40 * auVar48._28_4_ | (uint)!bVar40 * auVar51._28_4_;
          bVar40 = (bool)((byte)uVar34 & 1);
          auVar66._0_4_ = (uint)bVar40 * auVar49._0_4_ | (uint)!bVar40 * auVar52._0_4_;
          bVar40 = (bool)((byte)(uVar34 >> 1) & 1);
          auVar66._4_4_ = (uint)bVar40 * auVar49._4_4_ | (uint)!bVar40 * auVar52._4_4_;
          bVar40 = (bool)((byte)(uVar34 >> 2) & 1);
          auVar66._8_4_ = (uint)bVar40 * auVar49._8_4_ | (uint)!bVar40 * auVar52._8_4_;
          bVar40 = (bool)((byte)(uVar34 >> 3) & 1);
          auVar66._12_4_ = (uint)bVar40 * auVar49._12_4_ | (uint)!bVar40 * auVar52._12_4_;
          bVar40 = (bool)((byte)(uVar34 >> 4) & 1);
          auVar66._16_4_ = (uint)bVar40 * auVar49._16_4_ | (uint)!bVar40 * auVar52._16_4_;
          bVar40 = (bool)((byte)(uVar34 >> 5) & 1);
          auVar66._20_4_ = (uint)bVar40 * auVar49._20_4_ | (uint)!bVar40 * auVar52._20_4_;
          bVar40 = (bool)((byte)(uVar34 >> 6) & 1);
          auVar66._24_4_ = (uint)bVar40 * auVar49._24_4_ | (uint)!bVar40 * auVar52._24_4_;
          bVar40 = SUB81(uVar34 >> 7,0);
          auVar66._28_4_ = (uint)bVar40 * auVar49._28_4_ | (uint)!bVar40 * auVar52._28_4_;
          bVar40 = (bool)((byte)uVar13 & 1);
          auVar67._0_4_ = (float)((uint)bVar40 * auVar58._0_4_ | (uint)!bVar40 * auVar50._0_4_);
          bVar40 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar67._4_4_ = (float)((uint)bVar40 * auVar58._4_4_ | (uint)!bVar40 * auVar50._4_4_);
          bVar40 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar67._8_4_ = (float)((uint)bVar40 * auVar58._8_4_ | (uint)!bVar40 * auVar50._8_4_);
          bVar40 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar67._12_4_ = (float)((uint)bVar40 * auVar58._12_4_ | (uint)!bVar40 * auVar50._12_4_);
          bVar40 = (bool)((byte)(uVar13 >> 4) & 1);
          auVar67._16_4_ = (float)((uint)bVar40 * auVar58._16_4_ | (uint)!bVar40 * auVar50._16_4_);
          bVar40 = (bool)((byte)(uVar13 >> 5) & 1);
          auVar67._20_4_ = (float)((uint)bVar40 * auVar58._20_4_ | (uint)!bVar40 * auVar50._20_4_);
          bVar40 = (bool)((byte)(uVar13 >> 6) & 1);
          auVar67._24_4_ = (float)((uint)bVar40 * auVar58._24_4_ | (uint)!bVar40 * auVar50._24_4_);
          bVar40 = SUB81(uVar13 >> 7,0);
          auVar67._28_4_ = (uint)bVar40 * auVar58._28_4_ | (uint)!bVar40 * auVar50._28_4_;
          auVar57._4_4_ = fVar91 * auVar67._4_4_;
          auVar57._0_4_ = fVar89 * auVar67._0_4_;
          auVar57._8_4_ = fVar92 * auVar67._8_4_;
          auVar57._12_4_ = fVar93 * auVar67._12_4_;
          auVar57._16_4_ = fVar94 * auVar67._16_4_;
          auVar57._20_4_ = fVar95 * auVar67._20_4_;
          auVar57._24_4_ = fVar96 * auVar67._24_4_;
          auVar57._28_4_ = auVar76._28_4_;
          auVar77 = vfmadd213ps_fma(auVar47,auVar66,auVar57);
          auVar77 = vfmadd213ps_fma(auVar46,auVar65,ZEXT1632(auVar77));
          auVar47 = ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                       CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                CONCAT44(auVar77._4_4_ + auVar77._4_4_,
                                                         auVar77._0_4_ + auVar77._0_4_))));
          in_ZMM7 = ZEXT3264(auVar47);
          auVar87._0_4_ = auVar79._0_4_ * auVar67._0_4_;
          auVar87._4_4_ = auVar79._4_4_ * auVar67._4_4_;
          auVar87._8_4_ = auVar79._8_4_ * auVar67._8_4_;
          auVar87._12_4_ = auVar79._12_4_ * auVar67._12_4_;
          auVar87._16_4_ = auVar79._16_4_ * auVar67._16_4_;
          auVar87._20_4_ = auVar79._20_4_ * auVar67._20_4_;
          auVar87._24_4_ = auVar79._24_4_ * auVar67._24_4_;
          auVar87._28_4_ = 0;
          auVar77 = vfmadd213ps_fma(auVar78,auVar66,auVar87);
          auVar19 = vfmadd213ps_fma(auVar75,auVar65,ZEXT1632(auVar77));
          auVar45 = vrcp14ps_avx512vl(auVar47);
          auVar46 = vxorps_avx512vl(auVar47,auVar43);
          auVar76 = auVar102._0_32_;
          auVar43 = vfnmadd213ps_avx512vl(auVar45,auVar47,auVar76);
          auVar77 = vfmadd132ps_fma(auVar43,auVar45,auVar45);
          in_ZMM9 = ZEXT1664(auVar77);
          local_2a80 = *(undefined1 (*) [32])(ray + 0x100);
          auVar82._0_4_ = auVar77._0_4_ * (auVar19._0_4_ + auVar19._0_4_);
          auVar82._4_4_ = auVar77._4_4_ * (auVar19._4_4_ + auVar19._4_4_);
          auVar82._8_4_ = auVar77._8_4_ * (auVar19._8_4_ + auVar19._8_4_);
          auVar82._12_4_ = auVar77._12_4_ * (auVar19._12_4_ + auVar19._12_4_);
          auVar43 = ZEXT1632(auVar82);
          auVar83 = ZEXT3264(auVar43);
          uVar15 = vcmpps_avx512vl(auVar43,local_2a80,2);
          uVar16 = vcmpps_avx512vl(auVar43,*(undefined1 (*) [32])(ray + 0x60),0xd);
          uVar17 = vcmpps_avx512vl(auVar47,auVar46,4);
          bVar33 = bVar33 & (byte)uVar15 & (byte)uVar16 & (byte)uVar17;
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar99 = ZEXT3264(auVar45);
          if (bVar33 != 0) {
            pGVar3 = (context->scene->geometries).items[*(uint *)(lVar37 + -0x10 + uVar36 * 4)].ptr;
            uVar1 = pGVar3->mask;
            auVar85._4_4_ = uVar1;
            auVar85._0_4_ = uVar1;
            auVar85._8_4_ = uVar1;
            auVar85._12_4_ = uVar1;
            auVar85._16_4_ = uVar1;
            auVar85._20_4_ = uVar1;
            auVar85._24_4_ = uVar1;
            auVar85._28_4_ = uVar1;
            uVar15 = vptestmd_avx512vl(auVar85,*(undefined1 (*) [32])(ray + 0x120));
            bVar33 = bVar33 & (byte)uVar15;
            if (bVar33 != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                uVar41 = vcmpps_avx512vl(auVar44,auVar101._0_32_,5);
                auVar45 = vrcp14ps_avx512vl(auVar44);
                auVar44 = vfnmadd213ps_avx512vl(auVar44,auVar45,auVar76);
                auVar44 = vfmadd132ps_avx512vl(auVar44,auVar45,auVar45);
                fVar93 = (float)((uint)((byte)uVar41 & 1) * auVar44._0_4_);
                fVar92 = (float)((uint)((byte)(uVar41 >> 1) & 1) * auVar44._4_4_);
                fVar91 = (float)((uint)((byte)(uVar41 >> 2) & 1) * auVar44._8_4_);
                fVar89 = (float)((uint)((byte)(uVar41 >> 3) & 1) * auVar44._12_4_);
                fVar94 = (float)((uint)((byte)(uVar41 >> 4) & 1) * auVar44._16_4_);
                fVar95 = (float)((uint)((byte)(uVar41 >> 5) & 1) * auVar44._20_4_);
                fVar96 = (float)((uint)((byte)(uVar41 >> 6) & 1) * auVar44._24_4_);
                auVar23._4_4_ = fVar92 * auVar54._4_4_;
                auVar23._0_4_ = fVar93 * auVar54._0_4_;
                auVar23._8_4_ = fVar91 * auVar54._8_4_;
                auVar23._12_4_ = fVar89 * auVar54._12_4_;
                auVar23._16_4_ = fVar94 * auVar54._16_4_;
                auVar23._20_4_ = fVar95 * auVar54._20_4_;
                auVar23._24_4_ = fVar96 * auVar54._24_4_;
                auVar23._28_4_ = auVar54._28_4_;
                auVar44 = vminps_avx512vl(auVar23,auVar76);
                auVar24._4_4_ = fVar92 * auVar64._4_4_;
                auVar24._0_4_ = fVar93 * auVar64._0_4_;
                auVar24._8_4_ = fVar91 * auVar64._8_4_;
                auVar24._12_4_ = fVar89 * auVar64._12_4_;
                auVar24._16_4_ = fVar94 * auVar64._16_4_;
                auVar24._20_4_ = fVar95 * auVar64._20_4_;
                auVar24._24_4_ = fVar96 * auVar64._24_4_;
                auVar24._28_4_ = auVar64._28_4_;
                auVar45 = vminps_avx512vl(auVar24,auVar76);
                local_29a0 = vsubps_avx512vl(auVar76,auVar44);
                local_2980 = vsubps_avx512vl(auVar76,auVar45);
                pRVar4 = context->user;
                local_2940 = vpbroadcastd_avx512vl();
                local_2960 = vpbroadcastd_avx512vl();
                in_ZMM7 = ZEXT3264(local_2960);
                auVar44 = vpcmpeqd_avx2(auVar66,auVar66);
                local_2ab8[1] = auVar44;
                *local_2ab8 = auVar44;
                local_2920 = pRVar4->instID[0];
                local_2900 = pRVar4->instPrimID[0];
                auVar43 = vblendmps_avx512vl(local_2a80,auVar43);
                bVar40 = (bool)(bVar33 >> 1 & 1);
                bVar6 = (bool)(bVar33 >> 2 & 1);
                bVar7 = (bool)(bVar33 >> 3 & 1);
                bVar8 = (bool)(bVar33 >> 4 & 1);
                bVar9 = (bool)(bVar33 >> 5 & 1);
                bVar10 = (bool)(bVar33 >> 6 & 1);
                *(uint *)(ray + 0x100) =
                     (uint)(bVar33 & 1) * auVar43._0_4_ | !(bool)(bVar33 & 1) * local_2900;
                *(uint *)(ray + 0x104) = (uint)bVar40 * auVar43._4_4_ | !bVar40 * local_2900;
                *(uint *)(ray + 0x108) = (uint)bVar6 * auVar43._8_4_ | !bVar6 * local_2900;
                *(uint *)(ray + 0x10c) = (uint)bVar7 * auVar43._12_4_ | !bVar7 * local_2900;
                *(uint *)(ray + 0x110) = (uint)bVar8 * auVar43._16_4_ | !bVar8 * local_2900;
                *(uint *)(ray + 0x114) = (uint)bVar9 * auVar43._20_4_ | !bVar9 * local_2900;
                *(uint *)(ray + 0x118) = (uint)bVar10 * auVar43._24_4_ | !bVar10 * local_2900;
                *(uint *)(ray + 0x11c) =
                     (uint)(bVar33 >> 7) * auVar43._28_4_ | !(bool)(bVar33 >> 7) * local_2900;
                local_2a60 = vpmovm2d_avx512vl((ulong)bVar33);
                local_2ab0.valid = (int *)local_2a60;
                local_2ab0.geometryUserPtr = pGVar3->userPtr;
                local_2ab0.context = context->user;
                local_2ab0.hit = local_2a00;
                local_2ab0.N = 8;
                local_2ab0.ray = (RTCRayN *)ray;
                local_2a00 = (RTCHitN  [32])auVar65;
                local_29e0 = auVar66;
                local_29c0 = auVar67;
                uStack_291c = local_2920;
                uStack_2918 = local_2920;
                uStack_2914 = local_2920;
                uStack_2910 = local_2920;
                uStack_290c = local_2920;
                uStack_2908 = local_2920;
                uStack_2904 = local_2920;
                uStack_28fc = local_2900;
                uStack_28f8 = local_2900;
                uStack_28f4 = local_2900;
                uStack_28f0 = local_2900;
                uStack_28ec = local_2900;
                uStack_28e8 = local_2900;
                uStack_28e4 = local_2900;
                if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar83 = ZEXT1664(auVar82);
                  in_ZMM7 = ZEXT1664(local_2960._0_16_);
                  in_ZMM9 = ZEXT1664(auVar77);
                  local_2ae0 = ray;
                  (*pGVar3->occlusionFilterN)(&local_2ab0);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar98 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar99 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar105 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar104 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  auVar103 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar102 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                  auVar101 = ZEXT3264(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar100 = ZEXT3264(auVar43);
                  ray = local_2ae0;
                }
                uVar41 = vptestmd_avx512vl(local_2a60,local_2a60);
                if ((char)uVar41 != '\0') {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar83 = ZEXT1664(auVar83._0_16_);
                    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                    in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                    (*p_Var5)(&local_2ab0);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar98 = ZEXT3264(auVar43);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar99 = ZEXT3264(auVar43);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar105 = ZEXT3264(auVar43);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar104 = ZEXT3264(auVar43);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    auVar103 = ZEXT3264(auVar43);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar102 = ZEXT3264(auVar43);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                    auVar101 = ZEXT3264(auVar43);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar100 = ZEXT3264(auVar43);
                  }
                  uVar41 = vptestmd_avx512vl(local_2a60,local_2a60);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar40 = (bool)((byte)uVar41 & 1);
                  auVar68._0_4_ =
                       (uint)bVar40 * auVar43._0_4_ |
                       (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x100);
                  bVar40 = (bool)((byte)(uVar41 >> 1) & 1);
                  auVar68._4_4_ =
                       (uint)bVar40 * auVar43._4_4_ |
                       (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x104);
                  bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
                  auVar68._8_4_ =
                       (uint)bVar40 * auVar43._8_4_ |
                       (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x108);
                  bVar40 = (bool)((byte)(uVar41 >> 3) & 1);
                  auVar68._12_4_ =
                       (uint)bVar40 * auVar43._12_4_ |
                       (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x10c);
                  bVar40 = (bool)((byte)(uVar41 >> 4) & 1);
                  auVar68._16_4_ =
                       (uint)bVar40 * auVar43._16_4_ |
                       (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x110);
                  bVar40 = (bool)((byte)(uVar41 >> 5) & 1);
                  auVar68._20_4_ =
                       (uint)bVar40 * auVar43._20_4_ |
                       (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x114);
                  bVar40 = (bool)((byte)(uVar41 >> 6) & 1);
                  auVar68._24_4_ =
                       (uint)bVar40 * auVar43._24_4_ |
                       (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x118);
                  bVar40 = SUB81(uVar41 >> 7,0);
                  auVar68._28_4_ =
                       (uint)bVar40 * auVar43._28_4_ |
                       (uint)!bVar40 * *(int *)(local_2ab0.ray + 0x11c);
                  *(undefined1 (*) [32])(local_2ab0.ray + 0x100) = auVar68;
                }
                bVar33 = (byte)uVar41;
                bVar40 = (bool)((byte)(uVar41 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar41 >> 2) & 1);
                bVar7 = (bool)((byte)(uVar41 >> 3) & 1);
                bVar8 = (bool)((byte)(uVar41 >> 4) & 1);
                bVar9 = (bool)((byte)(uVar41 >> 5) & 1);
                bVar10 = (bool)((byte)(uVar41 >> 6) & 1);
                bVar11 = SUB81(uVar41 >> 7,0);
                *(uint *)local_2ac8 =
                     (uint)(bVar33 & 1) * *(int *)local_2ac8 |
                     (uint)!(bool)(bVar33 & 1) * local_2a80._0_4_;
                *(uint *)(local_2ac8 + 4) =
                     (uint)bVar40 * *(int *)(local_2ac8 + 4) | (uint)!bVar40 * local_2a80._4_4_;
                *(uint *)(local_2ac8 + 8) =
                     (uint)bVar6 * *(int *)(local_2ac8 + 8) | (uint)!bVar6 * local_2a80._8_4_;
                *(uint *)(local_2ac8 + 0xc) =
                     (uint)bVar7 * *(int *)(local_2ac8 + 0xc) | (uint)!bVar7 * local_2a80._12_4_;
                *(uint *)(local_2ac8 + 0x10) =
                     (uint)bVar8 * *(int *)(local_2ac8 + 0x10) | (uint)!bVar8 * local_2a80._16_4_;
                *(uint *)(local_2ac8 + 0x14) =
                     (uint)bVar9 * *(int *)(local_2ac8 + 0x14) | (uint)!bVar9 * local_2a80._20_4_;
                *(uint *)(local_2ac8 + 0x18) =
                     (uint)bVar10 * *(int *)(local_2ac8 + 0x18) | (uint)!bVar10 * local_2a80._24_4_;
                *(uint *)(local_2ac8 + 0x1c) =
                     (uint)bVar11 * *(int *)(local_2ac8 + 0x1c) | (uint)!bVar11 * local_2a80._28_4_;
              }
              bVar38 = bVar38 & ~bVar33;
            }
          }
        }
        bVar40 = bVar38 != 0;
      }
      if ((!bVar40) || (bVar40 = 2 < uVar36, uVar36 = uVar36 + 1, bVar40)) break;
    }
    bVar29 = bVar29 & bVar38;
    if (bVar29 == 0) break;
  }
  bVar29 = ~bVar29;
LAB_007add47:
  bVar30 = bVar30 | bVar29;
  uVar41 = local_2ad0;
  if (bVar30 == 0xff) {
LAB_007add76:
    iVar31 = 3;
  }
  else {
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    local_2740._0_4_ =
         (uint)(bVar30 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar30 & 1) * local_2740._0_4_;
    bVar40 = (bool)(bVar30 >> 1 & 1);
    local_2740._4_4_ = (uint)bVar40 * auVar43._4_4_ | (uint)!bVar40 * local_2740._4_4_;
    bVar40 = (bool)(bVar30 >> 2 & 1);
    local_2740._8_4_ = (uint)bVar40 * auVar43._8_4_ | (uint)!bVar40 * local_2740._8_4_;
    bVar40 = (bool)(bVar30 >> 3 & 1);
    local_2740._12_4_ = (uint)bVar40 * auVar43._12_4_ | (uint)!bVar40 * local_2740._12_4_;
    bVar40 = (bool)(bVar30 >> 4 & 1);
    local_2740._16_4_ = (uint)bVar40 * auVar43._16_4_ | (uint)!bVar40 * local_2740._16_4_;
    bVar40 = (bool)(bVar30 >> 5 & 1);
    local_2740._20_4_ = (uint)bVar40 * auVar43._20_4_ | (uint)!bVar40 * local_2740._20_4_;
    bVar40 = (bool)(bVar30 >> 6 & 1);
    local_2740._24_4_ = (uint)bVar40 * auVar43._24_4_ | (uint)!bVar40 * local_2740._24_4_;
    local_2740._28_4_ =
         (uint)(bVar30 >> 7) * auVar43._28_4_ | (uint)!(bool)(bVar30 >> 7) * local_2740._28_4_;
    iVar31 = 0;
  }
LAB_007add79:
  if (iVar31 == 3) {
    bVar30 = bVar30 & (byte)local_2abc;
    bVar40 = (bool)(bVar30 >> 1 & 1);
    bVar6 = (bool)(bVar30 >> 2 & 1);
    bVar7 = (bool)(bVar30 >> 3 & 1);
    bVar8 = (bool)(bVar30 >> 4 & 1);
    bVar9 = (bool)(bVar30 >> 5 & 1);
    bVar10 = (bool)(bVar30 >> 6 & 1);
    *(uint *)local_2ac8 =
         (uint)(bVar30 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar30 & 1) * *(int *)local_2ac8;
    *(uint *)(local_2ac8 + 4) =
         (uint)bVar40 * auVar103._4_4_ | (uint)!bVar40 * *(int *)(local_2ac8 + 4);
    *(uint *)(local_2ac8 + 8) =
         (uint)bVar6 * auVar103._8_4_ | (uint)!bVar6 * *(int *)(local_2ac8 + 8);
    *(uint *)(local_2ac8 + 0xc) =
         (uint)bVar7 * auVar103._12_4_ | (uint)!bVar7 * *(int *)(local_2ac8 + 0xc);
    *(uint *)(local_2ac8 + 0x10) =
         (uint)bVar8 * auVar103._16_4_ | (uint)!bVar8 * *(int *)(local_2ac8 + 0x10);
    *(uint *)(local_2ac8 + 0x14) =
         (uint)bVar9 * auVar103._20_4_ | (uint)!bVar9 * *(int *)(local_2ac8 + 0x14);
    *(uint *)(local_2ac8 + 0x18) =
         (uint)bVar10 * auVar103._24_4_ | (uint)!bVar10 * *(int *)(local_2ac8 + 0x18);
    *(uint *)(local_2ac8 + 0x1c) =
         (uint)(bVar30 >> 7) * auVar103._28_4_ |
         (uint)!(bool)(bVar30 >> 7) * *(int *)(local_2ac8 + 0x1c);
    return;
  }
  goto LAB_007acda4;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }